

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

TSRange * ts_tree_get_changed_ranges(TSTree *self,TSTree *other,uint32_t *count)

{
  TSNode node;
  TSNode node_00;
  uint uVar1;
  undefined1 local_88 [8];
  TSRangeArray included_range_differences;
  TSNode root;
  TreeCursor cursor2;
  TreeCursor cursor1;
  TSRange *result;
  uint32_t *count_local;
  TSTree *other_local;
  TSTree *self_local;
  
  memset(&cursor2.stack.size,0,0x18);
  memset(&root.tree,0,0x18);
  ts_tree_root_node((TSNode *)&included_range_differences.size,self);
  node.context[2] = root.context[0];
  node.context[3] = root.context[1];
  node.context[0] = included_range_differences.size;
  node.context[1] = included_range_differences.capacity;
  node.id = (void *)root.context._8_8_;
  node.tree = (TSTree *)root.id;
  ts_tree_cursor_init((TreeCursor *)&cursor2.stack.size,node);
  node_00.context[2] = root.context[0];
  node_00.context[3] = root.context[1];
  node_00.context[0] = included_range_differences.size;
  node_00.context[1] = included_range_differences.capacity;
  node_00.id = (void *)root.context._8_8_;
  node_00.tree = (TSTree *)root.id;
  ts_tree_cursor_init((TreeCursor *)&root.tree,node_00);
  memset(local_88,0,0x10);
  ts_range_array_get_changed_ranges
            (self->included_ranges,self->included_range_count,other->included_ranges,
             other->included_range_count,(TSRangeArray *)local_88);
  uVar1 = ts_subtree_get_changed_ranges
                    (&self->root,&other->root,(TreeCursor *)&cursor2.stack.size,
                     (TreeCursor *)&root.tree,self->language,(TSRangeArray *)local_88,
                     (TSRange **)&cursor1.stack.size);
  *count = uVar1;
  array__delete((VoidArray *)local_88);
  array__delete((VoidArray *)&cursor1);
  array__delete((VoidArray *)&cursor2);
  return (TSRange *)cursor1.stack._8_8_;
}

Assistant:

TSRange *ts_tree_get_changed_ranges(const TSTree *self, const TSTree *other, uint32_t *count) {
  TSRange *result;
  TreeCursor cursor1 = {NULL, array_new()};
  TreeCursor cursor2 = {NULL, array_new()};
  TSNode root = ts_tree_root_node(self);
  ts_tree_cursor_init(&cursor1, root);
  ts_tree_cursor_init(&cursor2, root);

  TSRangeArray included_range_differences = array_new();
  ts_range_array_get_changed_ranges(
    self->included_ranges, self->included_range_count,
    other->included_ranges, other->included_range_count,
    &included_range_differences
  );

  *count = ts_subtree_get_changed_ranges(
    &self->root, &other->root, &cursor1, &cursor2,
    self->language, &included_range_differences, &result
  );

  array_delete(&included_range_differences);
  array_delete(&cursor1.stack);
  array_delete(&cursor2.stack);
  return result;
}